

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void uv__udp_io(uv_loop_t *loop,uv__io_t *w,uint revents)

{
  uint *handle;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  sockaddr_in6 *psVar8;
  ssize_t sVar9;
  long lVar10;
  long *plVar11;
  ulong uVar12;
  ssize_t sVar13;
  uv_buf_t local_998;
  uint local_988;
  int local_984;
  long local_980;
  long local_978;
  uv_buf_t local_970;
  msghdr local_960;
  sockaddr_storage peer;
  iovec iov [20];
  uv__mmsghdr msgs [20];
  sockaddr_in6 peers [20];
  
  if (*(int *)&w[-2].cb != 0xf) {
    __assert_fail("handle->type == UV_UDP",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                  ,0xac,"void uv__udp_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  handle = &w[-3].pevents;
  if ((revents & 1) == 0) {
LAB_00118373:
    if ((revents & 4) != 0) {
      uv__udp_sendmsg((uv_udp_t *)handle);
      uv__udp_run_completed((uv_udp_t *)handle);
    }
    return;
  }
  if (*(long *)&w[-1].fd == 0) {
    __assert_fail("handle->recv_cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                  ,0xf6,"void uv__udp_recvmsg(uv_udp_t *)");
  }
  lVar10._0_4_ = w[-1].pevents;
  lVar10._4_4_ = w[-1].events;
  if (lVar10 == 0) {
    __assert_fail("handle->alloc_cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                  ,0xf7,"void uv__udp_recvmsg(uv_udp_t *)");
  }
  iVar6 = 0x20;
  local_988 = revents;
LAB_00118031:
  local_998 = uv_buf_init((char *)0x0,0);
  (**(code **)&w[-1].pevents)(handle,0x10000,&local_998);
  if ((local_998.base != (char *)0x0) && (local_998.len != 0)) {
    uv_once(&once,uv__udp_mmsg_init);
    if ((0x1ffff < local_998.len & uv__recvmmsg_avail) == 1) {
      uVar12 = local_998.len >> 0x10;
      if (0x13 < local_998.len >> 0x10) {
        uVar12 = 0x14;
      }
      psVar8 = peers;
      pcVar3 = local_998.base;
      for (uVar5 = 0; local_984 = iVar6, (uint)uVar12 << 4 != uVar5; uVar5 = uVar5 + 0x10) {
        plVar11 = (long *)((long)&iov[0].iov_base + uVar5);
        *plVar11 = (long)pcVar3;
        *(undefined8 *)((long)&iov[0].iov_len + uVar5) = 0x10000;
        *(long **)((long)&msgs[0].msg_hdr.msg_iov + uVar5 * 4) = plVar11;
        *(undefined8 *)((long)&msgs[0].msg_hdr.msg_iovlen + uVar5 * 4) = 1;
        *(sockaddr_in6 **)((long)&msgs[0].msg_hdr.msg_name + uVar5 * 4) = psVar8;
        (&msgs[0].msg_hdr.msg_namelen)[uVar5] = 0x1c;
        psVar8 = psVar8 + 1;
        pcVar3 = pcVar3 + 0x10000;
      }
LAB_001181ce:
      uVar2 = uv__recvmmsg(w->fd,msgs,(uint)uVar12,0,(timespec *)0x0);
      if (uVar2 == 0xffffffff) goto code_r0x001181ea;
      if (0 < (int)uVar2) {
        uVar12 = (ulong)uVar2;
        lVar10 = uVar12 * 0x10;
        local_980 = lVar10 + -8;
        lVar7 = 0;
        local_978 = lVar10;
        while ((local_978 + lVar7 != 0 && (*(long *)&w[-1].fd != 0))) {
          local_970 = uv_buf_init(*(char **)((long)&iov[uVar12 - 1].iov_base + lVar7),
                                  *(uint *)((long)iov + lVar7 + lVar10 + -8));
          (**(code **)&w[-1].fd)
                    (handle,*(undefined4 *)((long)msgs + lVar7 * 4 + uVar12 * 0x40 + -8),&local_970)
          ;
          lVar7 = lVar7 + -0x10;
        }
        goto LAB_00118308;
      }
      if (uVar2 == 0) goto LAB_001181ff;
      piVar4 = __errno_location();
      iVar6 = *piVar4;
      goto LAB_001181f6;
    }
    local_960.msg_controllen = 0;
    local_960.msg_flags = 0;
    local_960._52_4_ = 0;
    local_960.msg_control = (void *)0x0;
    peer.__ss_padding[0x6e] = '\0';
    peer.__ss_padding[0x6f] = '\0';
    peer.__ss_padding[0x70] = '\0';
    peer.__ss_padding[0x71] = '\0';
    peer.__ss_padding[0x72] = '\0';
    peer.__ss_padding[0x73] = '\0';
    peer.__ss_padding[0x74] = '\0';
    peer.__ss_padding[0x75] = '\0';
    peer.__ss_align = 0;
    peer.__ss_padding[0x5e] = '\0';
    peer.__ss_padding[0x5f] = '\0';
    peer.__ss_padding[0x60] = '\0';
    peer.__ss_padding[0x61] = '\0';
    peer.__ss_padding[0x62] = '\0';
    peer.__ss_padding[99] = '\0';
    peer.__ss_padding[100] = '\0';
    peer.__ss_padding[0x65] = '\0';
    peer.__ss_padding[0x66] = '\0';
    peer.__ss_padding[0x67] = '\0';
    peer.__ss_padding[0x68] = '\0';
    peer.__ss_padding[0x69] = '\0';
    peer.__ss_padding[0x6a] = '\0';
    peer.__ss_padding[0x6b] = '\0';
    peer.__ss_padding[0x6c] = '\0';
    peer.__ss_padding[0x6d] = '\0';
    peer.__ss_padding[0x4e] = '\0';
    peer.__ss_padding[0x4f] = '\0';
    peer.__ss_padding[0x50] = '\0';
    peer.__ss_padding[0x51] = '\0';
    peer.__ss_padding[0x52] = '\0';
    peer.__ss_padding[0x53] = '\0';
    peer.__ss_padding[0x54] = '\0';
    peer.__ss_padding[0x55] = '\0';
    peer.__ss_padding[0x56] = '\0';
    peer.__ss_padding[0x57] = '\0';
    peer.__ss_padding[0x58] = '\0';
    peer.__ss_padding[0x59] = '\0';
    peer.__ss_padding[0x5a] = '\0';
    peer.__ss_padding[0x5b] = '\0';
    peer.__ss_padding[0x5c] = '\0';
    peer.__ss_padding[0x5d] = '\0';
    peer.__ss_padding[0x3e] = '\0';
    peer.__ss_padding[0x3f] = '\0';
    peer.__ss_padding[0x40] = '\0';
    peer.__ss_padding[0x41] = '\0';
    peer.__ss_padding[0x42] = '\0';
    peer.__ss_padding[0x43] = '\0';
    peer.__ss_padding[0x44] = '\0';
    peer.__ss_padding[0x45] = '\0';
    peer.__ss_padding[0x46] = '\0';
    peer.__ss_padding[0x47] = '\0';
    peer.__ss_padding[0x48] = '\0';
    peer.__ss_padding[0x49] = '\0';
    peer.__ss_padding[0x4a] = '\0';
    peer.__ss_padding[0x4b] = '\0';
    peer.__ss_padding[0x4c] = '\0';
    peer.__ss_padding[0x4d] = '\0';
    peer.__ss_padding[0x2e] = '\0';
    peer.__ss_padding[0x2f] = '\0';
    peer.__ss_padding[0x30] = '\0';
    peer.__ss_padding[0x31] = '\0';
    peer.__ss_padding[0x32] = '\0';
    peer.__ss_padding[0x33] = '\0';
    peer.__ss_padding[0x34] = '\0';
    peer.__ss_padding[0x35] = '\0';
    peer.__ss_padding[0x36] = '\0';
    peer.__ss_padding[0x37] = '\0';
    peer.__ss_padding[0x38] = '\0';
    peer.__ss_padding[0x39] = '\0';
    peer.__ss_padding[0x3a] = '\0';
    peer.__ss_padding[0x3b] = '\0';
    peer.__ss_padding[0x3c] = '\0';
    peer.__ss_padding[0x3d] = '\0';
    peer.__ss_padding[0x1e] = '\0';
    peer.__ss_padding[0x1f] = '\0';
    peer.__ss_padding[0x20] = '\0';
    peer.__ss_padding[0x21] = '\0';
    peer.__ss_padding[0x22] = '\0';
    peer.__ss_padding[0x23] = '\0';
    peer.__ss_padding[0x24] = '\0';
    peer.__ss_padding[0x25] = '\0';
    peer.__ss_padding[0x26] = '\0';
    peer.__ss_padding[0x27] = '\0';
    peer.__ss_padding[0x28] = '\0';
    peer.__ss_padding[0x29] = '\0';
    peer.__ss_padding[0x2a] = '\0';
    peer.__ss_padding[0x2b] = '\0';
    peer.__ss_padding[0x2c] = '\0';
    peer.__ss_padding[0x2d] = '\0';
    peer.__ss_padding[0xe] = '\0';
    peer.__ss_padding[0xf] = '\0';
    peer.__ss_padding[0x10] = '\0';
    peer.__ss_padding[0x11] = '\0';
    peer.__ss_padding[0x12] = '\0';
    peer.__ss_padding[0x13] = '\0';
    peer.__ss_padding[0x14] = '\0';
    peer.__ss_padding[0x15] = '\0';
    peer.__ss_padding[0x16] = '\0';
    peer.__ss_padding[0x17] = '\0';
    peer.__ss_padding[0x18] = '\0';
    peer.__ss_padding[0x19] = '\0';
    peer.__ss_padding[0x1a] = '\0';
    peer.__ss_padding[0x1b] = '\0';
    peer.__ss_padding[0x1c] = '\0';
    peer.__ss_padding[0x1d] = '\0';
    peer.ss_family = 0;
    peer.__ss_padding[0] = '\0';
    peer.__ss_padding[1] = '\0';
    peer.__ss_padding[2] = '\0';
    peer.__ss_padding[3] = '\0';
    peer.__ss_padding[4] = '\0';
    peer.__ss_padding[5] = '\0';
    peer.__ss_padding[6] = '\0';
    peer.__ss_padding[7] = '\0';
    peer.__ss_padding[8] = '\0';
    peer.__ss_padding[9] = '\0';
    peer.__ss_padding[10] = '\0';
    peer.__ss_padding[0xb] = '\0';
    peer.__ss_padding[0xc] = '\0';
    peer.__ss_padding[0xd] = '\0';
    local_960.msg_name = &peer;
    local_960.msg_namelen = 0x80;
    local_960._12_4_ = 0;
    local_960.msg_iovlen = 1;
    local_960.msg_iov = (iovec *)&local_998;
    do {
      sVar13 = recvmsg(w->fd,&local_960,0);
      sVar9 = sVar13;
      if (sVar13 != -1) goto LAB_001182ea;
      piVar4 = __errno_location();
      iVar1 = *piVar4;
    } while ((long)iVar1 == 4);
    if (iVar1 == 0xb) {
      sVar9 = 0;
    }
    else {
      sVar9 = -(long)iVar1;
    }
LAB_001182ea:
    (**(code **)&w[-1].fd)(handle,sVar9,&local_998);
    iVar6 = iVar6 + -1;
    goto LAB_0011832d;
  }
  (**(code **)&w[-1].fd)(handle,0xffffffffffffff97,&local_998,0,0);
  goto LAB_00118373;
code_r0x001181ea:
  piVar4 = __errno_location();
  iVar6 = *piVar4;
  if (iVar6 != 4) goto LAB_001181f6;
  goto LAB_001181ce;
LAB_001181f6:
  if (iVar6 == 0xb) {
LAB_001181ff:
    lVar10 = 0;
  }
  else {
    lVar10 = (long)-iVar6;
  }
  (**(code **)&w[-1].fd)(handle,lVar10,&local_998);
LAB_00118308:
  sVar13 = (ssize_t)(int)uVar2;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  iVar6 = local_984 - uVar2;
  revents = local_988;
LAB_0011832d:
  if ((((sVar13 == -1) || (iVar6 < 1)) || (w->fd == -1)) || (*(long *)&w[-1].fd == 0))
  goto LAB_00118373;
  goto LAB_00118031;
}

Assistant:

static void uv__udp_io(uv_loop_t* loop, uv__io_t* w, unsigned int revents) {
  uv_udp_t* handle;

  handle = container_of(w, uv_udp_t, io_watcher);
  assert(handle->type == UV_UDP);

  if (revents & POLLIN)
    uv__udp_recvmsg(handle);

  if (revents & POLLOUT) {
    uv__udp_sendmsg(handle);
    uv__udp_run_completed(handle);
  }
}